

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O2

void __thiscall
slang::parsing::Preprocessor::applyProtectPragma
          (Preprocessor *this,PragmaDirectiveSyntax *pragma,
          SmallVectorBase<slang::parsing::Token> *skippedTokens)

{
  TokenKind kind;
  size_type sVar1;
  bool bVar2;
  SyntaxNode *this_00;
  SimplePragmaExpressionSyntax *pSVar3;
  NameValuePragmaExpressionSyntax *pNVar4;
  PragmaExpressionSyntax *args;
  SourceLocation SVar5;
  Info *pIVar6;
  undefined8 uVar7;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *__range2;
  Token keyword;
  SourceRange range;
  string_view sVar8;
  const_iterator __begin2;
  anon_class_16_2_cfeedcd7 handle;
  iterator_base<const_slang::syntax::PragmaExpressionSyntax_*> local_50;
  Token local_40;
  
  sVar1 = (pragma->args).elements.size_;
  if (sVar1 == 0) {
    local_40 = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)pragma);
    SVar5 = Token::location(&local_40);
    sVar8 = Token::rawText(&local_40);
    addDiag(this,(DiagCode)0x200004,(SourceLocation)((long)SVar5 + sVar8._M_len * 0x10000000));
  }
  else {
    local_40.info = (Info *)skippedTokens;
    local_40._0_8_ = this;
    local_50.list = &pragma->args;
    for (local_50.index = 0; (local_50.list != &pragma->args || (local_50.index != sVar1 + 1 >> 1));
        local_50.index = local_50.index + 1) {
      this_00 = &slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::
                 iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>::operator*(&local_50)
                 ->super_SyntaxNode;
      if (this_00->kind == NameValuePragmaExpression) {
        pNVar4 = slang::syntax::SyntaxNode::as<slang::syntax::NameValuePragmaExpressionSyntax>
                           (this_00);
        uVar7._0_2_ = (pNVar4->name).kind;
        uVar7._2_1_ = (pNVar4->name).field_0x2;
        uVar7._3_1_ = (pNVar4->name).numFlags;
        uVar7._4_4_ = (pNVar4->name).rawLen;
        pIVar6 = (pNVar4->name).info;
        args = not_null<slang::syntax::PragmaExpressionSyntax_*>::get(&pNVar4->value);
LAB_001851f5:
        keyword.info = pIVar6;
        keyword.kind = (short)uVar7;
        keyword._2_1_ = (char)((ulong)uVar7 >> 0x10);
        keyword.numFlags.raw = (char)((ulong)uVar7 >> 0x18);
        keyword.rawLen = (int)((ulong)uVar7 >> 0x20);
        applyProtectPragma::anon_class_16_2_cfeedcd7::operator()
                  ((anon_class_16_2_cfeedcd7 *)&local_40,keyword,args);
      }
      else {
        if (this_00->kind == SimplePragmaExpression) {
          pSVar3 = slang::syntax::SyntaxNode::as<slang::syntax::SimplePragmaExpressionSyntax>
                             (this_00);
          kind = (pSVar3->value).kind;
          if (kind != Identifier) {
            bVar2 = LexerFacts::isKeyword(kind);
            if (!bVar2) goto LAB_001851b1;
          }
          uVar7._0_2_ = (pSVar3->value).kind;
          uVar7._2_1_ = (pSVar3->value).field_0x2;
          uVar7._3_1_ = (pSVar3->value).numFlags;
          uVar7._4_4_ = (pSVar3->value).rawLen;
          pIVar6 = (pSVar3->value).info;
          args = (PragmaExpressionSyntax *)0x0;
          goto LAB_001851f5;
        }
LAB_001851b1:
        range = slang::syntax::SyntaxNode::sourceRange(this_00);
        addDiag(this,(DiagCode)0x200004,range);
      }
    }
  }
  return;
}

Assistant:

void Preprocessor::applyProtectPragma(const PragmaDirectiveSyntax& pragma,
                                      SmallVectorBase<Token>& skippedTokens) {
    if (pragma.args.empty()) {
        Token last = pragma.getLastToken();
        addDiag(diag::ExpectedProtectKeyword, last.location() + last.rawText().length());
        return;
    }

    auto handle = [&](Token keyword, const PragmaExpressionSyntax* args) {
        auto text = keyword.valueText();
        if (auto it = pragmaProtectHandlers.find(text); it != pragmaProtectHandlers.end())
            (this->*(it->second))(keyword, args, skippedTokens);
        else if (!text.empty())
            addDiag(diag::UnknownProtectKeyword, keyword.range()) << text;
    };

    for (auto arg : pragma.args) {
        if (arg->kind == SyntaxKind::SimplePragmaExpression) {
            auto& simple = arg->as<SimplePragmaExpressionSyntax>();
            if (simple.value.kind == TokenKind::Identifier ||
                LexerFacts::isKeyword(simple.value.kind)) {
                handle(simple.value, nullptr);
                continue;
            }
        }
        else if (arg->kind == SyntaxKind::NameValuePragmaExpression) {
            auto& nvp = arg->as<NameValuePragmaExpressionSyntax>();
            handle(nvp.name, nvp.value);
            continue;
        }

        addDiag(diag::ExpectedProtectKeyword, arg->sourceRange());
    }
}